

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

int * Acb_ObjFanins(Acb_Ntk_t *p,int i)

{
  int i_00;
  int *piVar1;
  int i_local;
  Acb_Ntk_t *p_local;
  
  i_00 = Acb_ObjFanOffset(p,i);
  piVar1 = Vec_IntEntryP(&p->vFanSto,i_00);
  return piVar1;
}

Assistant:

static inline int *          Acb_ObjFanins( Acb_Ntk_t * p, int i )                   { return Vec_IntEntryP(&p->vFanSto, Acb_ObjFanOffset(p, i));                                           }